

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

int __thiscall Jupiter::IRC::Client::readConfigInt(Client *this,string_view key,int defaultValue)

{
  int iVar1;
  string_view in_string;
  string_view sVar2;
  
  if (this->m_primary_section != (Config *)0x0) {
    sVar2 = Config::get(this->m_primary_section,key,(string_view)ZEXT816(0));
    in_string._M_str = sVar2._M_str;
    if ((Jupiter *)sVar2._M_len != (Jupiter *)0x0) {
      in_string._M_len = (size_t)in_string._M_str;
      iVar1 = from_string<int>((Jupiter *)sVar2._M_len,in_string);
      return iVar1;
    }
  }
  if (this->m_secondary_section != (Config *)0x0) {
    iVar1 = Config::get<int>(this->m_secondary_section,key,defaultValue);
    return iVar1;
  }
  return defaultValue;
}

Assistant:

int Jupiter::IRC::Client::readConfigInt(std::string_view key, int defaultValue) const {
	if (m_primary_section != nullptr) {
		std::string_view val = m_primary_section->get(key);

		if (!val.empty()) {
			return Jupiter::from_string<int>(val);
		}
	}

	if (m_secondary_section != nullptr) {
		return m_secondary_section->get<int>(key, defaultValue);
	}

	return defaultValue;
}